

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

int Sbc_ManWlcNodes(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGia2Out,int nOuts)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  uint Id;
  uint uVar11;
  
  p_00 = Vec_IntAlloc(100);
  Id = 1;
  do {
    if (pNtk->iObj <= (int)Id) {
      Id = 0xffffffff;
LAB_002ff473:
      Vec_IntFree(p_00);
      return Id;
    }
    pWVar7 = Wlc_NtkObj(pNtk,Id);
    iVar3 = Vec_IntEntry(&pNtk->vCopies,Id);
    uVar9 = pWVar7->End - pWVar7->Beg;
    uVar2 = -uVar9;
    if (0 < (int)uVar9) {
      uVar2 = uVar9;
    }
    p_00->nSize = 0;
    uVar9 = 0;
    uVar10 = 0;
    while (uVar11 = (uint)uVar10, uVar11 <= uVar2) {
      iVar4 = Vec_IntEntry(&pNtk->vBits,iVar3 + uVar11);
      iVar5 = Abc_Lit2Var(iVar4);
      iVar5 = Vec_IntEntry(vGia2Out,iVar5);
      if (iVar5 != -1) {
        iVar4 = Abc_LitIsCompl(iVar4);
        iVar4 = Abc_LitNotCond(iVar5,iVar4);
        pcVar8 = Wlc_ObjName(pNtk,(int)(((long)pWVar7 - (long)pNtk->pObjs) / 0x18));
        uVar6 = Abc_Lit2Var(iVar4);
        iVar5 = Abc_LitIsCompl(iVar4);
        printf("Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n",(ulong)Id,
               pcVar8,uVar10,(ulong)(uVar2 + 1),(ulong)uVar6,iVar5);
        iVar4 = Abc_Lit2Var(iVar4);
        if (uVar9 == p_00->nCap) {
          iVar5 = uVar9 * 2;
          if ((int)uVar9 < 0x10) {
            iVar5 = 0x10;
          }
          Vec_IntGrow(p_00,iVar5);
          uVar9 = p_00->nSize;
        }
        p_00->nSize = uVar9 + 1;
        piVar1 = p_00->pArray;
        for (uVar10 = (ulong)uVar9;
            (uVar6 = (int)uVar9 >> 0x1f & uVar9, 0 < (int)(uint)uVar10 &&
            (uVar6 = (uint)uVar10, iVar4 < piVar1[uVar10 - 1])); uVar10 = uVar10 - 1) {
          piVar1[uVar10] = piVar1[uVar10 - 1];
        }
        piVar1[(int)uVar6] = iVar4;
        uVar9 = uVar9 + 1;
      }
      uVar10 = (ulong)(uVar11 + 1);
    }
    if (0 < (int)uVar9) {
      putchar(10);
    }
    if (uVar9 == nOuts) {
      printf("Found object %d with all bits matched.\n",(ulong)Id);
      goto LAB_002ff473;
    }
    Id = Id + 1;
  } while( true );
}

Assistant:

int Sbc_ManWlcNodes( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGia2Out, int nOuts )
{
    Wlc_Obj_t * pObj;  
    int i, k, iLitGia, iLitOut, iFirst, nBits, iObjFound = -1;
    Vec_Int_t * vMatched = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        Vec_IntClear( vMatched );
        for ( k = 0; k < nBits; k++ )
        {
            iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            iLitOut = Vec_IntEntry( vGia2Out, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched node %5d (%10s) bit %3d (out of %3d) with output %3d(%d).\n", 
                i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits, Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut) );
            Vec_IntPushOrder( vMatched, Abc_Lit2Var(iLitOut) );
        }
        if ( Vec_IntSize(vMatched) > 0 )
            printf( "\n" );
        if ( Vec_IntSize(vMatched) == nOuts )
        {
            if ( iObjFound == -1 )
                iObjFound = i;
            printf( "Found object %d with all bits matched.\n", i );
            /*
            for ( k = nBits-2; k < nBits; k++ )
            {
                iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
                {
                    word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
                    Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
                }
            }
            */
            break;
        }
    }
    Vec_IntFree( vMatched );
    return iObjFound;
}